

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O1

void __thiscall
TransitionObservationIndependentMADPDiscrete::AddAgent
          (TransitionObservationIndependentMADPDiscrete *this,string *namestring)

{
  pointer *pppMVar1;
  pointer pcVar2;
  iterator __position;
  ostream *poVar3;
  MultiAgentDecisionProcessDiscrete *this_00;
  MultiAgentDecisionProcessDiscrete *m;
  stringstream name;
  stringstream pf;
  stringstream descr;
  string local_550;
  MultiAgentDecisionProcessDiscrete *local_530;
  string local_528;
  string local_508;
  string local_4e8;
  stringstream local_4c8 [16];
  ostream local_4b8 [112];
  ios_base aiStack_448 [264];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))();
  pcVar2 = (namestring->_M_dataplus)._M_p;
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,pcVar2,pcVar2 + namestring->_M_string_length);
  MultiAgentDecisionProcess::AddAgent(&this->super_MultiAgentDecisionProcess,&local_4e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream(local_4c8);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  std::__ostream_insert<char,std::char_traits<char>>(local_4b8,"Indiv.MADPDiscr.Agent",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,
             "The individual MADPDiscrete used to model the transition and observation dynamics for agent "
             ,0x5c);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(namestring->_M_dataplus)._M_p,namestring->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(agent ",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  MultiAgentDecisionProcess::GetProblemFile_abi_cxx11_
            (&local_550,&this->super_MultiAgentDecisionProcess);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_330,local_550._M_dataplus._M_p,local_550._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".agent",6);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  this_00 = (MultiAgentDecisionProcessDiscrete *)operator_new(0x208);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
            (this_00,1,0,&local_550,&local_508,&local_528);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  local_530 = this_00;
  MultiAgentDecisionProcessDiscrete::SetSparse(this_00,this->_m_sparse);
  __position._M_current =
       (this->_m_individualMADPDs).
       super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_m_individualMADPDs).
      super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<MultiAgentDecisionProcessDiscrete*,std::allocator<MultiAgentDecisionProcessDiscrete*>>::
    _M_realloc_insert<MultiAgentDecisionProcessDiscrete*const&>
              ((vector<MultiAgentDecisionProcessDiscrete*,std::allocator<MultiAgentDecisionProcessDiscrete*>>
                *)&this->_m_individualMADPDs,__position,&local_530);
  }
  else {
    *__position._M_current = local_530;
    pppMVar1 = &(this->_m_individualMADPDs).
                super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppMVar1 = *pppMVar1 + 1;
  }
  (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x30))(this,0);
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base(aiStack_448);
  return;
}

Assistant:

void TransitionObservationIndependentMADPDiscrete::AddAgent(const string &namestring)
{
    Index i = GetNrAgents();//the old number of agents
    MultiAgentDecisionProcess::AddAgent(namestring);

    stringstream name, descr, pf;
    name << "Indiv.MADPDiscr.Agent"<<i;
    descr << "The individual MADPDiscrete used to model the transition \
and observation dynamics for agent "<<namestring <<"(agent "<<i<<")";
    pf << GetProblemFile() << ".agent" << i;

    MultiAgentDecisionProcessDiscrete* m = new 
        MultiAgentDecisionProcessDiscrete(1, 0, name.str(), descr.str(),
               pf.str() );
    m->SetSparse(_m_sparse);
    _m_individualMADPDs.push_back( m );

    SetInitialized(false);
}